

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_audio_buffer_ref_get_cursor_in_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pCursor)

{
  ma_uint64 *pCursor_local;
  ma_audio_buffer_ref *pAudioBufferRef_local;
  
  if (pCursor == (ma_uint64 *)0x0) {
    pAudioBufferRef_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0;
    if (pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
      pAudioBufferRef_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      *pCursor = pAudioBufferRef->cursor;
      pAudioBufferRef_local._4_4_ = MA_SUCCESS;
    }
  }
  return pAudioBufferRef_local._4_4_;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_cursor_in_pcm_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = pAudioBufferRef->cursor;

    return MA_SUCCESS;
}